

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_f5df0e::DirectoryObject::DumpInstallerPath
          (Value *__return_storage_ptr__,DirectoryObject *this,string *top,string *fromPathIn,
          string *toPath)

{
  bool bVar1;
  long lVar2;
  Value *pVVar3;
  string_view str;
  string_view suffix;
  string fromPath;
  Value local_48;
  
  Json::Value::Value(__return_storage_ptr__,nullValue);
  cmSystemTools::RelativeIfUnder(&fromPath,(string *)this,top);
  lVar2 = std::__cxx11::string::find((char)fromPathIn,0x2f);
  if (lVar2 == -1) {
    str._M_str = fromPath._M_dataplus._M_p;
    str._M_len = fromPath._M_string_length;
    suffix._M_str = (fromPathIn->_M_dataplus)._M_p;
    suffix._M_len = fromPathIn->_M_string_length;
    bVar1 = cmHasSuffix(str,suffix);
    if (bVar1) {
      if ((fromPath._M_string_length == fromPathIn->_M_string_length) ||
         (fromPath._M_dataplus._M_p[~fromPathIn->_M_string_length + fromPath._M_string_length] ==
          '/')) {
        Json::Value::Value(&local_48,&fromPath);
        pVVar3 = __return_storage_ptr__;
        goto LAB_00322efb;
      }
    }
  }
  Json::Value::Value(&local_48,objectValue);
  Json::Value::operator=(__return_storage_ptr__,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_48,&fromPath);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"from");
  Json::Value::operator=(pVVar3,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_48,fromPathIn);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"to");
LAB_00322efb:
  Json::Value::operator=(pVVar3,&local_48);
  Json::Value::~Value(&local_48);
  std::__cxx11::string::~string((string *)&fromPath);
  return __return_storage_ptr__;
}

Assistant:

Json::Value DirectoryObject::DumpInstallerPath(std::string const& top,
                                               std::string const& fromPathIn,
                                               std::string const& toPath)
{
  Json::Value installPath;

  std::string fromPath = RelativeIfUnder(top, fromPathIn);

  // If toPath is the last component of fromPath, use just fromPath.
  if (toPath.find_first_of('/') == std::string::npos &&
      cmHasSuffix(fromPath, toPath) &&
      (fromPath.size() == toPath.size() ||
       fromPath[fromPath.size() - toPath.size() - 1] == '/')) {
    installPath = fromPath;
  } else {
    installPath = Json::objectValue;
    installPath["from"] = fromPath;
    installPath["to"] = toPath;
  }

  return installPath;
}